

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::BuiltStyledStreamWriter::writeIndent(BuiltStyledStreamWriter *this)

{
  ulong uVar1;
  ostream *poVar2;
  BuiltStyledStreamWriter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((this->super_StreamWriter).sout_,'\n');
    std::operator<<(poVar2,(string *)&this->indentString_);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeIndent() {
  // blep intended this to look at the so-far-written string
  // to determine whether we are already indented, but
  // with a stream we cannot do that. So we rely on some saved state.
  // The caller checks indented_.

  if (!indentation_.empty()) {
    // In this case, drop newlines too.
    *sout_ << '\n' << indentString_;
  }
}